

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

uint arm_pamax(ARMCPU_conflict1 *cpu)

{
  uint64_t uVar1;
  
  uVar1 = extract64((cpu->isar).id_aa64mmfr0,0,4);
  if ((uVar1 & 0xffffffff) < 6) {
    return arm_pamax::pamax_map[uVar1 & 0xffffffff];
  }
  __assert_fail("parange < ARRAY_SIZE(pamax_map)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                ,0xf7,"unsigned int arm_pamax(ARMCPU *)");
}

Assistant:

static inline unsigned int arm_pamax(ARMCPU *cpu)
{
    static const unsigned int pamax_map[] = {
        [0] = 32,
        [1] = 36,
        [2] = 40,
        [3] = 42,
        [4] = 44,
        [5] = 48,
    };
    unsigned int parange =
        FIELD_EX64(cpu->isar.id_aa64mmfr0, ID_AA64MMFR0, PARANGE);

    /* id_aa64mmfr0 is a read-only register so values outside of the
     * supported mappings can be considered an implementation error.  */
    assert(parange < ARRAY_SIZE(pamax_map));
    return pamax_map[parange];
}